

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O2

void __thiscall
iutest::DefaultXmlGeneratorListener::SetFilePath(DefaultXmlGeneratorListener *this,string *path)

{
  string *psVar1;
  long lVar2;
  
  if (path->_M_string_length != 0) {
    psVar1 = &this->m_output_path_format;
    std::__cxx11::string::_M_assign((string *)psVar1);
    lVar2 = std::__cxx11::string::find((char)path,0x2e);
    if ((lVar2 == -1) || (lVar2 == path->_M_string_length - 1)) {
      std::__cxx11::string::push_back((char)psVar1);
      std::__cxx11::string::append((char *)psVar1);
    }
    std::__cxx11::string::_M_assign((string *)&this->m_output_path);
    return;
  }
  (this->m_output_path_format)._M_string_length = 0;
  *(this->m_output_path_format)._M_dataplus._M_p = '\0';
  std::__cxx11::string::assign((char *)&this->m_output_path);
  return;
}

Assistant:

void SetFilePath(const ::std::string& path)
    {
        if( path.empty() )
        {
            m_output_path_format.clear();
            m_output_path = detail::kStrings::DefaultXmlReportFileName;
        }
        else
        {
            m_output_path_format = path;
            const ::std::string::size_type pos = path.find('.');
            if( pos == ::std::string::npos
                || pos == path.length()-1 )
            {
                m_output_path_format += detail::GetPathSeparator();
                m_output_path_format += detail::kStrings::DefaultXmlReportFileName;
            }
            m_output_path = m_output_path_format;
        }
    }